

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

void Curl_cpool_xfer_init(Curl_easy *data)

{
  long lVar1;
  Curl_easy *pCVar2;
  cpool *pcVar3;
  
  pcVar3 = cpool_get_instance(data);
  if (pcVar3 == (cpool *)0x0) {
    data->id = 0;
    (data->state).lastconnect_id = -1;
  }
  else {
    if ((pcVar3->share != (Curl_share *)0x0) && ((pcVar3->share->specifier & 0x20) != 0)) {
      Curl_share_lock(pcVar3->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    pcVar3->field_0x98 = pcVar3->field_0x98 | 1;
    lVar1 = pcVar3->next_easy_id;
    pcVar3->next_easy_id = lVar1 + 1;
    data->id = lVar1;
    if (lVar1 < 0) {
      pcVar3->next_easy_id = 0;
    }
    (data->state).lastconnect_id = -1;
    pCVar2 = pcVar3->idata;
    (pCVar2->set).timeout = (data->set).timeout;
    (pCVar2->set).server_response_timeout = (data->set).server_response_timeout;
    *(ulong *)&(pCVar2->set).field_0x8ca =
         *(ulong *)&(pCVar2->set).field_0x8ca & 0xffffffff7fffffff |
         (ulong)((uint)*(undefined8 *)&(data->set).field_0x8ca & 0x80000000);
    pcVar3->field_0x98 = pcVar3->field_0x98 & 0xfe;
    if ((pcVar3->share != (Curl_share *)0x0) && ((pcVar3->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(pcVar3->idata,CURL_LOCK_DATA_CONNECT);
      return;
    }
  }
  return;
}

Assistant:

void Curl_cpool_xfer_init(struct Curl_easy *data)
{
  struct cpool *cpool = cpool_get_instance(data);

  DEBUGASSERT(cpool);
  if(cpool) {
    CPOOL_LOCK(cpool);
    /* the identifier inside the connection cache */
    data->id = cpool->next_easy_id++;
    if(cpool->next_easy_id <= 0)
      cpool->next_easy_id = 0;
    data->state.lastconnect_id = -1;

    /* The closure handle only ever has default timeouts set. To improve the
       state somewhat we clone the timeouts from each added handle so that the
       closure handle always has the same timeouts as the most recently added
       easy handle. */
    cpool->idata->set.timeout = data->set.timeout;
    cpool->idata->set.server_response_timeout =
      data->set.server_response_timeout;
    cpool->idata->set.no_signal = data->set.no_signal;

    CPOOL_UNLOCK(cpool);
  }
  else {
    /* We should not get here, but in a non-debug build, do something */
    data->id = 0;
    data->state.lastconnect_id = -1;
  }
}